

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int jsonParseValue(JsonParse *pParse,u32 i)

{
  u8 *puVar1;
  byte bVar2;
  char *pcVar3;
  byte bVar4;
  long lVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  char cVar9;
  ulong uVar10;
  uint uVar11;
  u32 uVar12;
  u8 uVar13;
  int iVar14;
  byte bVar16;
  long lVar17;
  uint uVar18;
  char *__s1;
  bool bVar19;
  ulong uVar15;
  
  pcVar3 = pParse->zJson;
  uVar10 = (ulong)i;
  do {
    uVar15 = uVar10;
    iVar14 = (int)uVar15;
    bVar16 = pcVar3[uVar15];
    uVar18 = iVar14 + 1;
    uVar10 = (ulong)uVar18;
  } while (""[bVar16] != '\0');
  __s1 = pcVar3 + uVar15;
  if (bVar16 < 0x6e) {
    if (bVar16 == 0x22) {
      bVar16 = pcVar3[uVar18];
      if (bVar16 < 0x20) {
        return -1;
      }
      uVar13 = '\0';
      uVar10 = (ulong)uVar18;
      do {
        iVar14 = (int)uVar15;
        if (bVar16 == 0x5c) {
          uVar15 = (ulong)(iVar14 + 2);
          bVar16 = pcVar3[uVar15];
          uVar13 = '\x02';
          if ((0x37 < bVar16 - 0x2f) ||
             ((0x88200000000001U >> ((ulong)(bVar16 - 0x2f) & 0x3f) & 1) == 0)) {
            switch(bVar16) {
            case 0x6e:
            case 0x72:
            case 0x74:
              break;
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x73:
              return -1;
            case 0x75:
              lVar17 = 1;
              do {
                lVar5 = lVar17 + uVar15;
                if ((""[(byte)pcVar3[lVar5]] & 8) == 0) break;
                bVar19 = lVar17 != 4;
                lVar17 = lVar17 + 1;
              } while (bVar19);
              if ((""[(byte)pcVar3[lVar5]] & 8) == 0) {
                return -1;
              }
              break;
            default:
              if (bVar16 != 0x22) {
                return -1;
              }
            }
          }
        }
        else {
          uVar15 = uVar10;
          if (bVar16 == 0x22) {
            jsonParseAddNode(pParse,5,(iVar14 - uVar18) + 3,__s1);
            if (pParse->oom == '\0') {
              pParse->aNode[pParse->nNode - 1].jnFlags = uVar13;
              return iVar14 + 2;
            }
            return iVar14 + 2;
          }
        }
        uVar10 = (ulong)((int)uVar15 + 1);
        bVar16 = pcVar3[uVar10];
        if (bVar16 < 0x20) {
          return -1;
        }
      } while( true );
    }
    if (bVar16 == 0x5b) {
      uVar18 = jsonParseAddNode(pParse,6,0,(char *)0x0);
      if ((int)uVar18 < 0) {
        return -1;
      }
      do {
        do {
          iVar14 = (int)uVar15;
          uVar15 = (ulong)(iVar14 + 1U);
        } while (""[(byte)pcVar3[uVar15]] != '\0');
        uVar6 = pParse->iDepth + 1;
        pParse->iDepth = uVar6;
        if (2000 < uVar6) {
          return -1;
        }
        uVar7 = jsonParseValue(pParse,iVar14 + 1U);
        pParse->iDepth = pParse->iDepth - 1;
        if ((int)uVar7 < 0) {
          bVar19 = uVar7 == 0xfffffffd;
LAB_001cf56e:
          if (!bVar19) {
            return -1;
          }
          if (pParse->nNode == uVar18 + 1) {
            return iVar14 + 2;
          }
          return -1;
        }
        do {
          uVar11 = uVar7;
          bVar16 = pcVar3[uVar11];
          uVar7 = uVar11 + 1;
        } while (""[bVar16] != '\0');
        uVar15 = (ulong)uVar11;
      } while (bVar16 == 0x2c);
      bVar19 = bVar16 == 0x5d;
LAB_001cf237:
      if (bVar19) {
        pParse->aNode[uVar18].n = ~uVar18 + pParse->nNode;
        return uVar7;
      }
      return -1;
    }
  }
  else {
    if (bVar16 == 0x6e) {
      iVar8 = strncmp(__s1,"null",4);
      if ((iVar8 != 0) || (uVar7 = iVar14 + 4, (""[(byte)pcVar3[uVar7]] & 6) != 0))
      goto LAB_001cf3dc;
      uVar12 = 0;
      goto LAB_001cf557;
    }
    if (bVar16 != 0x74) {
      if (bVar16 == 0x7b) {
        uVar18 = jsonParseAddNode(pParse,7,0,(char *)0x0);
        if ((int)uVar18 < 0) {
          return -1;
        }
        do {
          do {
            iVar14 = (int)uVar15;
            uVar15 = (ulong)(iVar14 + 1U);
          } while (""[(byte)pcVar3[uVar15]] != '\0');
          uVar6 = pParse->iDepth + 1;
          pParse->iDepth = uVar6;
          if (2000 < uVar6) {
            return -1;
          }
          uVar7 = jsonParseValue(pParse,iVar14 + 1U);
          if ((int)uVar7 < 0) {
            pParse->iDepth = pParse->iDepth - 1;
            bVar19 = uVar7 == 0xfffffffe;
            goto LAB_001cf56e;
          }
          if (pParse->oom != '\0') {
            return -1;
          }
          uVar11 = pParse->nNode - 1;
          if (pParse->aNode[uVar11].eType != '\x05') {
            return -1;
          }
          puVar1 = &pParse->aNode[uVar11].jnFlags;
          *puVar1 = *puVar1 | 0x40;
          do {
            uVar10 = (ulong)uVar7;
            uVar7 = uVar7 + 1;
          } while (""[(byte)pcVar3[uVar10]] != '\0');
          if (pcVar3[uVar10] != 0x3a) {
            return -1;
          }
          uVar7 = jsonParseValue(pParse,uVar7);
          pParse->iDepth = pParse->iDepth - 1;
          if ((int)uVar7 < 0) {
            return -1;
          }
          do {
            uVar11 = uVar7;
            bVar16 = pcVar3[uVar11];
            uVar7 = uVar11 + 1;
          } while (""[bVar16] != '\0');
          uVar15 = (ulong)uVar11;
        } while (bVar16 == 0x2c);
        bVar19 = bVar16 == 0x7d;
        goto LAB_001cf237;
      }
      goto LAB_001cf3dc;
    }
    iVar8 = strncmp(__s1,"true",4);
    if ((iVar8 == 0) && (uVar7 = iVar14 + 4, (""[(byte)pcVar3[uVar7]] & 6) == 0)) {
      uVar12 = 1;
      goto LAB_001cf557;
    }
  }
  if (((bVar16 != 0x66) || (iVar8 = strncmp(__s1,"false",5), iVar8 != 0)) ||
     (uVar7 = iVar14 + 5, (""[(byte)pcVar3[uVar7]] & 6) != 0)) {
LAB_001cf3dc:
    if (bVar16 == 0x2d || (byte)(bVar16 - 0x30) < 10) {
      if ((((char)bVar16 < '1') && (pcVar3[((bVar16 == 0x2d) + uVar18) - 1] == '0')) &&
         ((byte)(pcVar3[(bVar16 == 0x2d) + uVar18] - 0x30U) < 10)) {
        return -1;
      }
      bVar16 = 1;
      bVar4 = bVar16;
      do {
        while( true ) {
          uVar12 = ((int)uVar15 - uVar18) + 1;
          do {
            uVar10 = uVar15;
            iVar14 = (int)uVar10;
            uVar15 = (ulong)(iVar14 + 1U);
            bVar2 = pcVar3[uVar15];
            uVar12 = uVar12 + 1;
          } while ((byte)(bVar2 - 0x30) < 10);
          if (bVar2 == 0x2e) break;
          if ((bVar2 & 0xdf) != 0x45) {
            if ('/' < pcVar3[uVar10]) {
              jsonParseAddNode(pParse,4 - bVar16,uVar12,__s1);
              return iVar14 + 1U;
            }
            return -1;
          }
          if ((~bVar4 & 1) != 0 || pcVar3[uVar10] < '0') {
            return -1;
          }
          cVar9 = pcVar3[iVar14 + 2];
          if ((cVar9 == '-') || (cVar9 == '+')) {
            cVar9 = pcVar3[iVar14 + 3];
            uVar15 = (ulong)(iVar14 + 2);
          }
          bVar16 = 0;
          bVar4 = bVar16;
          if ((byte)(cVar9 - 0x3aU) < 0xf6) {
            return -1;
          }
        }
        bVar19 = (bool)(pcVar3[uVar10] != '-' & bVar16);
        bVar16 = 0;
      } while (bVar19);
    }
    else {
      if (bVar16 == 0) {
        return 0;
      }
      if (bVar16 == 0x7d) {
        return -2;
      }
      if (bVar16 == 0x5d) {
        return -3;
      }
    }
    return -1;
  }
  uVar12 = 2;
LAB_001cf557:
  jsonParseAddNode(pParse,uVar12,0,(char *)0x0);
  return uVar7;
}

Assistant:

static int jsonParseValue(JsonParse *pParse, u32 i){
  char c;
  u32 j;
  int iThis;
  int x;
  JsonNode *pNode;
  const char *z = pParse->zJson;
  while( safe_isspace(z[i]) ){ i++; }
  if( (c = z[i])=='{' ){
    /* Parse object */
    iThis = jsonParseAddNode(pParse, JSON_OBJECT, 0, 0);
    if( iThis<0 ) return -1;
    for(j=i+1;;j++){
      while( safe_isspace(z[j]) ){ j++; }
      if( ++pParse->iDepth > JSON_MAX_DEPTH ) return -1;
      x = jsonParseValue(pParse, j);
      if( x<0 ){
        pParse->iDepth--;
        if( x==(-2) && pParse->nNode==(u32)iThis+1 ) return j+1;
        return -1;
      }
      if( pParse->oom ) return -1;
      pNode = &pParse->aNode[pParse->nNode-1];
      if( pNode->eType!=JSON_STRING ) return -1;
      pNode->jnFlags |= JNODE_LABEL;
      j = x;
      while( safe_isspace(z[j]) ){ j++; }
      if( z[j]!=':' ) return -1;
      j++;
      x = jsonParseValue(pParse, j);
      pParse->iDepth--;
      if( x<0 ) return -1;
      j = x;
      while( safe_isspace(z[j]) ){ j++; }
      c = z[j];
      if( c==',' ) continue;
      if( c!='}' ) return -1;
      break;
    }
    pParse->aNode[iThis].n = pParse->nNode - (u32)iThis - 1;
    return j+1;
  }else if( c=='[' ){
    /* Parse array */
    iThis = jsonParseAddNode(pParse, JSON_ARRAY, 0, 0);
    if( iThis<0 ) return -1;
    for(j=i+1;;j++){
      while( safe_isspace(z[j]) ){ j++; }
      if( ++pParse->iDepth > JSON_MAX_DEPTH ) return -1;
      x = jsonParseValue(pParse, j);
      pParse->iDepth--;
      if( x<0 ){
        if( x==(-3) && pParse->nNode==(u32)iThis+1 ) return j+1;
        return -1;
      }
      j = x;
      while( safe_isspace(z[j]) ){ j++; }
      c = z[j];
      if( c==',' ) continue;
      if( c!=']' ) return -1;
      break;
    }
    pParse->aNode[iThis].n = pParse->nNode - (u32)iThis - 1;
    return j+1;
  }else if( c=='"' ){
    /* Parse string */
    u8 jnFlags = 0;
    j = i+1;
    for(;;){
      c = z[j];
      if( (c & ~0x1f)==0 ){
        /* Control characters are not allowed in strings */
        return -1;
      }
      if( c=='\\' ){
        c = z[++j];
        if( c=='"' || c=='\\' || c=='/' || c=='b' || c=='f'
           || c=='n' || c=='r' || c=='t'
           || (c=='u' && jsonIs4Hex(z+j+1)) ){
          jnFlags = JNODE_ESCAPE;
        }else{
          return -1;
        }
      }else if( c=='"' ){
        break;
      }
      j++;
    }
    jsonParseAddNode(pParse, JSON_STRING, j+1-i, &z[i]);
    if( !pParse->oom ) pParse->aNode[pParse->nNode-1].jnFlags = jnFlags;
    return j+1;
  }else if( c=='n'
         && strncmp(z+i,"null",4)==0
         && !safe_isalnum(z[i+4]) ){
    jsonParseAddNode(pParse, JSON_NULL, 0, 0);
    return i+4;
  }else if( c=='t'
         && strncmp(z+i,"true",4)==0
         && !safe_isalnum(z[i+4]) ){
    jsonParseAddNode(pParse, JSON_TRUE, 0, 0);
    return i+4;
  }else if( c=='f'
         && strncmp(z+i,"false",5)==0
         && !safe_isalnum(z[i+5]) ){
    jsonParseAddNode(pParse, JSON_FALSE, 0, 0);
    return i+5;
  }else if( c=='-' || (c>='0' && c<='9') ){
    /* Parse number */
    u8 seenDP = 0;
    u8 seenE = 0;
    assert( '-' < '0' );
    if( c<='0' ){
      j = c=='-' ? i+1 : i;
      if( z[j]=='0' && z[j+1]>='0' && z[j+1]<='9' ) return -1;
    }
    j = i+1;
    for(;; j++){
      c = z[j];
      if( c>='0' && c<='9' ) continue;
      if( c=='.' ){
        if( z[j-1]=='-' ) return -1;
        if( seenDP ) return -1;
        seenDP = 1;
        continue;
      }
      if( c=='e' || c=='E' ){
        if( z[j-1]<'0' ) return -1;
        if( seenE ) return -1;
        seenDP = seenE = 1;
        c = z[j+1];
        if( c=='+' || c=='-' ){
          j++;
          c = z[j+1];
        }
        if( c<'0' || c>'9' ) return -1;
        continue;
      }
      break;
    }
    if( z[j-1]<'0' ) return -1;
    jsonParseAddNode(pParse, seenDP ? JSON_REAL : JSON_INT,
                        j - i, &z[i]);
    return j;
  }else if( c=='}' ){
    return -2;  /* End of {...} */
  }else if( c==']' ){
    return -3;  /* End of [...] */
  }else if( c==0 ){
    return 0;   /* End of file */
  }else{
    return -1;  /* Syntax error */
  }
}